

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles3::Functional::RoundCase::compare(RoundCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  pointer pSVar2;
  void *pvVar3;
  void *pvVar4;
  deUint32 aBits;
  uint uVar5;
  int iVar6;
  ostream *poVar7;
  int iVar8;
  bool bVar9;
  uint uVar10;
  ostringstream *poVar11;
  int iVar12;
  float fVar13;
  ulong uVar14;
  deUint32 bBits_1;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  deUint32 u32;
  float fVar19;
  HexFloat local_54;
  Hex<8UL> local_50;
  ulong local_48;
  void *local_40;
  HexFloat local_34;
  
  pSVar2 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar2->varType).m_data.basic.precision;
  uVar5 = glu::getDataTypeScalarSize((pSVar2->varType).m_data.basic.type);
  if (PVar1 - PRECISION_MEDIUMP < 2) {
    if (0 < (int)uVar5) {
      pvVar3 = *inputs;
      pvVar4 = *outputs;
      uVar14 = 0;
      do {
        fVar13 = *(float *)((long)pvVar3 + uVar14 * 4);
        fVar16 = *(float *)((long)pvVar4 + uVar14 * 4);
        fVar15 = floorf(fVar13);
        fVar19 = fVar13 - fVar15;
        if ((fVar19 != 0.5) || (NAN(fVar19))) {
          iVar8 = (uint)(0.5 < fVar19) + (int)(fVar13 - fVar19);
          fVar15 = (float)iVar8;
          if (PVar1 == PRECISION_HIGHP) {
LAB_01298d93:
            fVar13 = (float)((int)fVar15 - (int)fVar16);
            if ((uint)fVar15 < (uint)fVar16) {
              fVar13 = (float)-((int)fVar15 - (int)fVar16);
            }
          }
          else if ((fVar16 != 0.0) || (NAN(fVar16))) {
            if (iVar8 != 0) goto LAB_01298d93;
            fVar13 = ABS(fVar16);
          }
          else {
            fVar13 = ABS(fVar15);
          }
          if (fVar13 != 0.0) {
            poVar11 = &(this->super_CommonFunctionCase).m_failMsg;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&poVar11->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10)
            ;
            poVar7 = (ostream *)std::ostream::operator<<(poVar11,(int)uVar14);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] = ",4);
            local_54.value = fVar15;
            poVar7 = Functional::operator<<(poVar7,&local_54);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", got ULP diff ",0xf);
LAB_012991e1:
            local_50.value._4_4_ = 0;
            local_50.value._0_4_ = fVar13;
            tcu::Format::Hex<8UL>::toStream(&local_50,poVar7);
            return false;
          }
        }
        else {
          fVar19 = ceilf(fVar13);
          if (PVar1 == PRECISION_HIGHP) {
            fVar17 = (float)((int)fVar15 - (int)fVar16);
            if ((uint)fVar15 < (uint)fVar16) {
              fVar17 = (float)-((int)fVar15 - (int)fVar16);
            }
          }
          else if (((fVar16 == 0.0) && (fVar13 = fVar15, !NAN(fVar16))) ||
                  ((fVar15 == 0.0 && (fVar13 = fVar16, !NAN(fVar15))))) {
            fVar17 = ABS(fVar13);
          }
          else {
            fVar17 = (float)((int)fVar15 - (int)fVar16);
            if ((uint)fVar15 < (uint)fVar16) {
              fVar17 = (float)-((int)fVar15 - (int)fVar16);
            }
          }
          if (PVar1 == PRECISION_HIGHP) {
LAB_01298dec:
            fVar13 = (float)((int)fVar19 - (int)fVar16);
            if ((uint)fVar19 < (uint)fVar16) {
              fVar13 = (float)-((int)fVar19 - (int)fVar16);
            }
          }
          else if ((fVar16 != 0.0) || (NAN(fVar16))) {
            if ((fVar19 != 0.0) || (NAN(fVar19))) goto LAB_01298dec;
            fVar13 = ABS(fVar16);
          }
          else {
            fVar13 = ABS(fVar19);
          }
          if ((fVar17 != 0.0) && (fVar13 != 0.0)) {
            poVar11 = &(this->super_CommonFunctionCase).m_failMsg;
            std::__ostream_insert<char,std::char_traits<char>>
                      (&poVar11->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10)
            ;
            poVar7 = (ostream *)std::ostream::operator<<(poVar11,(int)uVar14);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] = ",4);
            local_54.value = fVar15;
            poVar7 = Functional::operator<<(poVar7,&local_54);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7," or ",4);
            local_34.value = fVar19;
            poVar7 = Functional::operator<<(poVar7,&local_34);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", got ULP diff ",0xf);
            if ((uint)fVar17 < (uint)fVar13) {
              fVar13 = fVar17;
            }
            goto LAB_012991e1;
          }
        }
        uVar14 = uVar14 + 1;
      } while (uVar5 != uVar14);
    }
  }
  else {
    uVar10 = -1 << (0x17 - (&DAT_01c60718)[(ulong)PVar1 * 4] & 0x1f);
    if (0 < (int)uVar5) {
      fVar16 = (float)(uVar10 & 0x7fffff ^ 0x3fffffff) + -1.0;
      fVar13 = (float)~uVar10;
      local_40 = *inputs;
      pvVar3 = *outputs;
      local_48 = (ulong)uVar5;
      uVar14 = 0;
      do {
        fVar15 = *(float *)((long)local_40 + uVar14 * 4);
        fVar19 = *(float *)((long)pvVar3 + uVar14 * 4);
        fVar17 = fVar15 - fVar16;
        fVar18 = floorf(fVar17);
        fVar18 = fVar17 - fVar18;
        iVar8 = (int)(fVar17 - fVar18);
        if (fVar18 <= 0.5) {
          iVar8 = iVar8 + (uint)((byte)iVar8 & fVar18 == 0.5);
        }
        else {
          iVar8 = iVar8 + 1;
        }
        fVar15 = fVar15 + fVar16;
        fVar17 = floorf(fVar15);
        fVar17 = fVar15 - fVar17;
        iVar6 = (int)(fVar15 - fVar17);
        if (fVar17 <= 0.5) {
          iVar6 = iVar6 + (uint)((byte)iVar6 & fVar17 == 0.5);
        }
        else {
          iVar6 = iVar6 + 1;
        }
        iVar8 = (int)(float)iVar8;
        iVar6 = (int)(float)iVar6;
        if (iVar6 < iVar8) {
LAB_01299017:
          poVar11 = &(this->super_CommonFunctionCase).m_failMsg;
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar11->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
          poVar7 = (ostream *)std::ostream::operator<<(poVar11,(int)uVar14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] = [",5);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] with ULP threshold ",0x15);
          goto LAB_012991e1;
        }
        bVar9 = false;
        iVar12 = iVar8;
        do {
          fVar15 = (float)iVar12;
          if ((fVar19 != 0.0) || (NAN(fVar19))) {
            fVar17 = ABS(fVar19);
            if (iVar12 != 0) {
              fVar17 = (float)((int)fVar15 - (int)fVar19);
              if ((uint)fVar15 < (uint)fVar19) {
                fVar17 = (float)-((int)fVar15 - (int)fVar19);
              }
            }
          }
          else {
            fVar17 = ABS(fVar15);
          }
          if ((uint)fVar17 <= (uint)fVar13) {
            bVar9 = true;
            break;
          }
          iVar12 = iVar12 + 1;
        } while (iVar12 <= iVar6);
        if (!bVar9) goto LAB_01299017;
        uVar14 = uVar14 + 1;
      } while (uVar14 != local_48);
    }
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				hasZeroSign		= supportsSignedZero(precision);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP || precision == glu::PRECISION_MEDIUMP)
		{
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];

				if (deFloatFrac(in0) == 0.5f)
				{
					// Allow both ceil(in) and floor(in)
					const float		ref0		= deFloatFloor(in0);
					const float		ref1		= deFloatCeil(in0);
					const deUint32	ulpDiff0	= hasZeroSign ? getUlpDiff(out0, ref0) : getUlpDiffIgnoreZeroSign(out0, ref0);
					const deUint32	ulpDiff1	= hasZeroSign ? getUlpDiff(out0, ref1) : getUlpDiffIgnoreZeroSign(out0, ref1);

					if (ulpDiff0 > 0 && ulpDiff1 > 0)
					{
						m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref0) << " or " << HexFloat(ref1) << ", got ULP diff " << tcu::toHex(de::min(ulpDiff0, ulpDiff1));
						return false;
					}
				}
				else
				{
					// Require exact result
					const float		ref		= roundEven(in0);
					const deUint32	ulpDiff	= hasZeroSign ? getUlpDiff(out0, ref) : getUlpDiffIgnoreZeroSign(out0, ref);

					if (ulpDiff > 0)
					{
						m_failMsg << "Expected [" << compNdx << "] = " << HexFloat(ref) << ", got ULP diff " << tcu::toHex(ulpDiff);
						return false;
					}
				}
			}
		}
		else
		{
			const int		mantissaBits	= getMinMantissaBits(precision);
			const deUint32	maxUlpDiff		= getMaxUlpDiffFromBits(mantissaBits);	// ULP diff for rounded integer value.
			const float		eps				= getEpsFromBits(1.0f, mantissaBits);	// epsilon for rounding bounds

			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0			= ((const float*)inputs[0])[compNdx];
				const float		out0		= ((const float*)outputs[0])[compNdx];
				const int		minRes		= int(roundEven(in0-eps));
				const int		maxRes		= int(roundEven(in0+eps));
				bool			anyOk		= false;

				for (int roundedVal = minRes; roundedVal <= maxRes; roundedVal++)
				{
					const deUint32 ulpDiff = getUlpDiffIgnoreZeroSign(out0, float(roundedVal));

					if (ulpDiff <= maxUlpDiff)
					{
						anyOk = true;
						break;
					}
				}

				if (!anyOk)
				{
					m_failMsg << "Expected [" << compNdx << "] = [" << minRes << ", " << maxRes << "] with ULP threshold " << tcu::toHex(maxUlpDiff);
					return false;
				}
			}
		}

		return true;
	}